

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompareDump.cpp
# Opt level: O0

void __thiscall
sliced_chunk_iterator::sliced_chunk_iterator
          (sliced_chunk_iterator *this,comparer_context *ctx,long end)

{
  long lVar1;
  long end_local;
  comparer_context *ctx_local;
  sliced_chunk_iterator *this_local;
  
  this->ctx = ctx;
  std::pair<unsigned_int,_unsigned_int>::pair<unsigned_int,_unsigned_int,_true>(&this->current);
  this->endit = false;
  lVar1 = std::numeric_limits<long>::max();
  this->next = lVar1;
  this->end = end;
  load_next(this);
  return;
}

Assistant:

sliced_chunk_iterator(comparer_context& ctx, long end)
        : ctx(ctx)
        , endit(false)
        , next(std::numeric_limits<long>::max())
        , end(end)
    {
        load_next();
    }